

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O0

string * absl::lts_20240722::log_internal::MakeCheckOpString<long,unsigned_long>
                   (long v1,unsigned_long v2,char *exprtext)

{
  ostream *poVar1;
  string *psVar2;
  CheckOpMessageBuilder local_198 [8];
  CheckOpMessageBuilder comb;
  char *exprtext_local;
  unsigned_long v2_local;
  long v1_local;
  
  exprtext_local = (char *)v2;
  v2_local = v1;
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder(local_198,exprtext)
  ;
  poVar1 = CheckOpMessageBuilder::ForVar1(local_198);
  MakeCheckOpValueString<long>(poVar1,(long *)&v2_local);
  poVar1 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  MakeCheckOpValueString<unsigned_long>(poVar1,(unsigned_long *)&exprtext_local);
  psVar2 = (string *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_()
  ;
  CheckOpMessageBuilder::~CheckOpMessageBuilder(local_198);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}